

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O3

StructNew * __thiscall
wasm::Builder::makeStructNew<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
          (Builder *this,HeapType type,
          vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *args)

{
  StructNew *pSVar1;
  MixedArena *this_00;
  Type local_30;
  
  this_00 = &this->wasm->allocator;
  pSVar1 = (StructNew *)MixedArena::allocSpace(this_00,0x30,8);
  (pSVar1->super_SpecificExpression<(wasm::Expression::Id)60>).super_Expression._id = StructNewId;
  (pSVar1->super_SpecificExpression<(wasm::Expression::Id)60>).super_Expression.type.id = 0;
  (pSVar1->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
       = (Expression **)0x0;
  (pSVar1->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  usedElements = 0;
  (pSVar1->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  allocatedElements = 0;
  (pSVar1->operands).allocator = this_00;
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
  set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
            ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)&pSVar1->operands,
             args);
  ::wasm::Type::Type(&local_30,type,NonNullable);
  (pSVar1->super_SpecificExpression<(wasm::Expression::Id)60>).super_Expression.type.id =
       local_30.id;
  ::wasm::StructNew::finalize();
  return pSVar1;
}

Assistant:

StructNew* makeStructNew(HeapType type, const T& args) {
    auto* ret = wasm.allocator.alloc<StructNew>();
    ret->operands.set(args);
    ret->type = Type(type, NonNullable);
    ret->finalize();
    return ret;
  }